

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sparsehashtable.h
# Opt level: O2

bool __thiscall
google::
sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
::maybe_shrink(sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
               *this)

{
  bool bVar1;
  ulong uVar2;
  ulong uVar3;
  ulong min_buckets_wanted;
  ulong uVar4;
  float fVar5;
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  tmp;
  sparse_hashtable<std::pair<const_HashObject<16,_16>,_int>,_HashObject<16,_16>,_HashFn,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SelectKey,_google::sparse_hash_map<HashObject<16,_16>,_int,_HashFn,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>::SetKey,_std::equal_to<HashObject<16,_16>_>,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>
  local_70;
  
  uVar3 = (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>
          .shrink_threshold_;
  uVar2 = (this->table).settings.num_buckets - this->num_deleted;
  if ((uVar2 < uVar3 && uVar3 != 0) && (uVar3 = (this->table).settings.table_size, 0x20 < uVar3)) {
    do {
      min_buckets_wanted = uVar3 >> 1;
      if (uVar3 < 0x42) break;
      fVar5 = (float)min_buckets_wanted *
              (this->settings).
              super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
              shrink_factor_;
      uVar4 = (ulong)fVar5;
      uVar3 = min_buckets_wanted;
    } while (uVar2 < ((long)(fVar5 - 9.223372e+18) & (long)uVar4 >> 0x3f | uVar4));
    sparse_hashtable(&local_70,MoveDontCopy,this,min_buckets_wanted);
    swap(this,&local_70);
    std::
    vector<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>,_google::libc_allocator_with_realloc<google::sparsegroup<std::pair<const_HashObject<16,_16>,_int>,_(unsigned_short)48,_google::libc_allocator_with_realloc<std::pair<const_HashObject<16,_16>,_int>_>_>_>_>
    ::~vector(&local_70.table.groups);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  (this->settings).super_sh_hashtable_settings<HashObject<16,_16>,_HashFn,_unsigned_long,_4>.
  consider_shrink_ = false;
  return bVar1;
}

Assistant:

bool maybe_shrink() {
    assert(table.num_nonempty() >= num_deleted);
    assert((bucket_count() & (bucket_count() - 1)) == 0);  // is a power of two
    assert(bucket_count() >= HT_MIN_BUCKETS);
    bool retval = false;

    // If you construct a hashtable with < HT_DEFAULT_STARTING_BUCKETS,
    // we'll never shrink until you get relatively big, and we'll never
    // shrink below HT_DEFAULT_STARTING_BUCKETS.  Otherwise, something
    // like "dense_hash_set<int> x; x.insert(4); x.erase(4);" will
    // shrink us down to HT_MIN_BUCKETS buckets, which is too small.
    const size_type num_remain = table.num_nonempty() - num_deleted;
    const size_type shrink_threshold = settings.shrink_threshold();
    if (shrink_threshold > 0 && num_remain < shrink_threshold &&
        bucket_count() > HT_DEFAULT_STARTING_BUCKETS) {
      const float shrink_factor = settings.shrink_factor();
      size_type sz = bucket_count() / 2;  // find how much we should shrink
      while (sz > HT_DEFAULT_STARTING_BUCKETS &&
             num_remain < static_cast<size_type>(sz * shrink_factor)) {
        sz /= 2;  // stay a power of 2
      }
      sparse_hashtable tmp(MoveDontCopy, *this, sz);
      swap(tmp);  // now we are tmp
      retval = true;
    }
    settings.set_consider_shrink(false);  // because we just considered it
    return retval;
  }